

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O2

Vec_Int_t * Abc_NtkRetimeCollectLatchValues(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Abc_Obj_t *pLatch;
  long lVar3;
  int i;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *local_38;
  
  uVar5 = pNtk->nObjCounts[8];
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  if (uVar5 - 1 < 0xf) {
    uVar5 = 0x10;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar5;
  uVar4 = 0;
  if (uVar5 == 0) {
    local_38 = (int *)0x0;
  }
  else {
    local_38 = (int *)malloc((long)(int)uVar5 << 2);
  }
  pVVar2->pArray = local_38;
  i = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      return pVVar2;
    }
    pLatch = Abc_NtkObj(pNtk,i);
    if ((pLatch != (Abc_Obj_t *)0x0) && ((*(uint *)&pLatch->field_0x14 & 0xf) == 8)) {
      iVar1 = Abc_LatchIsInit1(pLatch);
      if (uVar4 == uVar5) {
        uVar6 = uVar5 * 2;
        if ((int)uVar5 < 0x10) {
          uVar6 = 0x10;
        }
        if ((int)uVar5 < (int)uVar6) {
          if (local_38 == (int *)0x0) {
            local_38 = (int *)malloc((ulong)uVar6 << 2);
          }
          else {
            local_38 = (int *)realloc(local_38,(ulong)uVar6 << 2);
          }
          pVVar2->pArray = local_38;
          if (local_38 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar2->nCap = uVar6;
          uVar5 = uVar6;
        }
      }
      lVar3 = (long)(int)uVar4;
      uVar4 = uVar4 + 1;
      pVVar2->nSize = uVar4;
      local_38[lVar3] = iVar1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Abc_NtkRetimeCollectLatchValues( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vValues;
    Abc_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            Vec_IntPush( vValues, Abc_LatchIsInit1(pObj) );
    return vValues;
}